

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

WebPEncodingError
VP8LGetBackwardReferences
          (int width,int height,uint32_t *argb,int quality,int low_effort,int lz77_types_to_try,
          int cache_bits_max,int do_no_cache,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs,
          int *cache_bits_best)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint32_t pix;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  void *ptr;
  VP8LColorCache *pVVar13;
  VP8LHistogram *pVVar14;
  byte bVar15;
  short sVar16;
  uint uVar17;
  VP8LBackwardRefs *refs_dst;
  long *plVar18;
  VP8LBackwardRefs *pVVar19;
  uint uVar20;
  VP8LBackwardRefs *pVVar21;
  int dist;
  PixOrCopy *v;
  PixOrCopy *pPVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  PixOrCopy v_00;
  long lVar28;
  long lVar29;
  ushort uVar30;
  VP8LHashChain *hash_chain_00;
  uint uVar31;
  uint uVar32;
  undefined4 in_register_0000008c;
  VP8LBackwardRefs *pVVar33;
  uint32_t *puVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  uint *puVar40;
  bool bVar41;
  double dVar42;
  uint32_t *puVar43;
  int lz77_types_best [2];
  VP8LHashChain local_248;
  VP8LHistogram *local_230;
  uint32_t *local_228;
  uint local_21c;
  VP8LBackwardRefs *local_218;
  ulong local_210;
  ulong local_208;
  uint64_t local_200;
  long local_1f8;
  long *local_1f0;
  double bit_costs_best [2];
  VP8LColorCache hashers_1;
  VP8LRefsCursor c;
  int window_offsets [32];
  int cc_init [11];
  
  pVVar19 = (VP8LBackwardRefs *)CONCAT44(in_register_0000008c,lz77_types_to_try);
  if (low_effort == 0) {
    lz77_types_best[0] = 0;
    lz77_types_best[1] = 0;
    bit_costs_best[0] = 1.79769313486232e+308;
    bit_costs_best[1] = 1.79769313486232e+308;
    local_218 = refs + 1;
    refs_dst = refs + 2;
    if (do_no_cache == 0) {
      refs_dst = local_218;
    }
    local_248.offset_length_ = (uint32_t *)0x0;
    local_248._8_8_ = 0;
    local_230 = VP8LAllocateHistogram(10);
    if (local_230 == (VP8LHistogram *)0x0) {
LAB_0013726f:
      WebPSafeFree(local_248.offset_length_);
      local_248._8_8_ = local_248._8_8_ & 0xffffffff00000000;
      local_248.offset_length_ = (uint32_t *)0x0;
      VP8LFreeHistogram(local_230);
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    iVar5 = height * width;
    local_200 = (long)iVar5;
    local_1f8 = -(long)width;
    uVar36 = cache_bits_max;
    if (quality < 0x1a) {
      uVar36 = 0;
    }
    pVVar21 = (VP8LBackwardRefs *)(ulong)uVar36;
    lVar12 = (long)(int)uVar36;
    lVar29 = -1;
    if (-1 < lVar12) {
      lVar29 = lVar12;
    }
    uVar38 = lVar29 + 1;
    bVar15 = 0x20 - (char)uVar36;
    local_1f0 = (long *)(window_offsets + (long)pVVar21 * 4);
    uVar17 = 1;
    while (lz77_types_to_try != 0) {
      local_21c = lz77_types_to_try;
      if ((lz77_types_to_try & uVar17) != 0) {
        iVar10 = (int)hash_chain;
        if (uVar17 == 1) {
LAB_00136b1c:
          uVar39 = BackwardReferencesLz77
                             (width,height,argb,iVar10,(VP8LHashChain *)refs_dst,pVVar19);
        }
        else if (uVar17 == 4) {
          iVar10 = VP8LHashChainInit(&local_248,iVar5);
          if (iVar10 == 0) goto LAB_0013726f;
          window_offsets[0x1c] = 0;
          window_offsets[0x1d] = 0;
          window_offsets[0x1e] = 0;
          window_offsets[0x1f] = 0;
          window_offsets[0x18] = 0;
          window_offsets[0x19] = 0;
          window_offsets[0x1a] = 0;
          window_offsets[0x1b] = 0;
          window_offsets[0x14] = 0;
          window_offsets[0x15] = 0;
          window_offsets[0x16] = 0;
          window_offsets[0x17] = 0;
          window_offsets[0x10] = 0;
          window_offsets[0x11] = 0;
          window_offsets[0x12] = 0;
          window_offsets[0x13] = 0;
          window_offsets[0xc] = 0;
          window_offsets[0xd] = 0;
          window_offsets[0xe] = 0;
          window_offsets[0xf] = 0;
          window_offsets[8] = 0;
          window_offsets[9] = 0;
          window_offsets[10] = 0;
          window_offsets[0xb] = 0;
          window_offsets[4] = 0;
          window_offsets[5] = 0;
          window_offsets[6] = 0;
          window_offsets[7] = 0;
          window_offsets[0] = 0;
          window_offsets[1] = 0;
          window_offsets[2] = 0;
          window_offsets[3] = 0;
          hashers_1.colors_ = (uint32_t *)0x0;
          hashers_1.hash_shift_ = 0;
          hashers_1.hash_bits_ = 0;
          ptr = WebPSafeMalloc(local_200,2);
          if (ptr != (void *)0x0) {
            *(undefined2 *)((long)ptr + (long)(iVar5 + -2) * 2 + 2) = 1;
            for (uVar24 = (long)(iVar5 + -2); -1 < (int)uVar24; uVar24 = uVar24 - 1) {
              sVar16 = 1;
              if (argb[uVar24 & 0xffffffff] == argb[(uVar24 & 0xffffffff) + 1]) {
                sVar16 = *(short *)((long)ptr + uVar24 * 2 + 2);
                sVar16 = (ushort)(sVar16 != 0xfff) + sVar16;
              }
              *(short *)((long)ptr + uVar24 * 2) = sVar16;
            }
            iVar6 = 0;
            for (iVar10 = 0; iVar10 != 7; iVar10 = iVar10 + 1) {
              for (iVar7 = -6; iVar7 != 7; iVar7 = iVar7 + 1) {
                dist = iVar6 + iVar7;
                if ((0 < dist) && (iVar8 = VP8LDistanceToPlaneCode(width,dist), iVar8 < 0x21)) {
                  window_offsets[(long)iVar8 + -1] = dist;
                }
              }
              iVar6 = iVar6 + width;
            }
            uVar39 = 0;
            for (lVar29 = 0; lVar28 = (long)(int)uVar39, lVar29 != 0x20; lVar29 = lVar29 + 1) {
              if (window_offsets[lVar29] != 0) {
                uVar39 = uVar39 + 1;
                window_offsets[lVar28] = window_offsets[lVar29];
              }
            }
            uVar24 = 0;
            local_208 = 0;
            if (0 < (int)uVar39) {
              local_208 = (ulong)uVar39;
            }
            local_210 = 0;
            for (; uVar11 = (uint)local_210, uVar24 != local_208; uVar24 = uVar24 + 1) {
              lVar29 = 0;
              bVar41 = false;
              while ((lVar29 < lVar28 && (!bVar41))) {
                piVar1 = window_offsets + lVar29;
                lVar29 = lVar29 + 1;
                bVar41 = window_offsets[uVar24] == *piVar1 + 1;
              }
              if (!bVar41) {
                *(int *)((long)&hashers_1.colors_ + (long)(int)uVar11 * 4) = window_offsets[uVar24];
                local_210 = (ulong)(uVar11 + 1);
              }
            }
            local_228 = local_248.offset_length_;
            *local_248.offset_length_ = 0;
            uVar32 = 0xffffffff;
            pVVar19 = (VP8LBackwardRefs *)0xffffffff;
            for (uVar24 = 1; (long)uVar24 < (long)local_200; uVar24 = uVar24 + 1) {
              if ((~hash_chain->offset_length_[uVar24] & 0xfff) == 0) {
                uVar27 = hash_chain->offset_length_[uVar24] >> 0xc;
                uVar37 = 0;
                do {
                  if (local_208 == uVar37) goto LAB_001369b3;
                  puVar40 = (uint *)(window_offsets + uVar37);
                  uVar37 = uVar37 + 1;
                } while (uVar27 != *puVar40);
                uVar31 = 0xfff;
LAB_00136ad9:
                uVar9 = uVar27 << 0xc | uVar31;
                uVar26 = uVar31;
                uVar32 = uVar27;
              }
              else {
LAB_001369b3:
                uVar9 = (int)pVVar19 - 2;
                uVar26 = uVar39;
                if (uVar9 < 0xffd) {
                  uVar26 = uVar11;
                }
                uVar31 = (int)pVVar19 - 1;
                if (uVar9 >= 0xffd) {
                  uVar32 = 0;
                  uVar31 = 0;
                }
                if ((int)uVar26 < 1) {
                  uVar26 = 0;
                }
                uVar27 = uVar32;
                for (uVar37 = 0; uVar37 != uVar26; uVar37 = uVar37 + 1) {
                  pVVar13 = (VP8LColorCache *)window_offsets;
                  if (uVar9 < 0xffd) {
                    pVVar13 = &hashers_1;
                  }
                  uVar32 = *(uint *)((long)&pVVar13->colors_ + uVar37 * 4);
                  uVar25 = (int)uVar24 - uVar32;
                  if ((-1 < (int)uVar25) && (argb[uVar25] == argb[uVar24])) {
                    uVar35 = 0;
                    uVar23 = uVar24 & 0xffffffff;
                    do {
                      uVar3 = *(ushort *)((long)ptr + (ulong)uVar25 * 2);
                      uVar2 = *(ushort *)((long)ptr + (long)(int)uVar23 * 2);
                      uVar20 = (uint)uVar3;
                      if (uVar3 == uVar2) {
                        uVar25 = uVar25 + uVar20;
                        uVar23 = (ulong)((int)uVar23 + uVar20);
                      }
                      else {
                        uVar30 = uVar2;
                        if (uVar3 < uVar2) {
                          uVar30 = uVar3;
                        }
                        uVar20 = (uint)uVar30;
                      }
                      uVar35 = uVar35 + uVar20;
                    } while ((((uVar3 == uVar2) && (uVar35 < 0x1000)) && ((int)uVar23 < iVar5)) &&
                            (argb[uVar25] == argb[(int)uVar23]));
                    if (((int)uVar31 < (int)uVar35) &&
                       (uVar31 = uVar35, uVar27 = uVar32, 0xffe < uVar35)) {
                      uVar31 = 0xfff;
                      goto LAB_00136ad9;
                    }
                  }
                }
                uVar9 = 0;
                uVar26 = 0;
                uVar32 = 0;
                if (4 < (int)uVar31) goto LAB_00136ad9;
              }
              local_248.offset_length_[uVar24] = uVar9;
              pVVar19 = (VP8LBackwardRefs *)(ulong)uVar26;
            }
            *local_248.offset_length_ = 0;
            WebPSafeFree(ptr);
            iVar10 = (int)&local_248;
            goto LAB_00136b1c;
          }
          uVar39 = 0;
        }
        else {
          if (uVar17 != 2) goto LAB_0013726f;
          VP8LClearBackwardRefs(refs_dst);
          VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)*argb << 0x20 | 0x10000));
          for (uVar39 = 1; (int)uVar39 < iVar5; uVar39 = uVar39 + iVar7) {
            iVar10 = iVar5 - uVar39;
            if (0xffe < (int)(iVar5 - uVar39)) {
              iVar10 = 0xfff;
            }
            puVar43 = argb + uVar39;
            iVar6 = 0;
            if (*puVar43 == puVar43[-1]) {
              iVar6 = (*VP8LVectorMismatch)(puVar43,argb + ((ulong)uVar39 - 1),iVar10);
            }
            iVar7 = 0;
            if ((width <= (int)uVar39) && (*puVar43 == puVar43[local_1f8])) {
              iVar7 = (*VP8LVectorMismatch)(puVar43,puVar43 + local_1f8,iVar10);
            }
            if ((iVar6 < 4) || (iVar6 < iVar7)) {
              if (iVar7 < 4) {
                v_00 = (PixOrCopy)((ulong)*puVar43 << 0x20 | 0x10000);
                iVar7 = 1;
              }
              else {
                v_00 = (PixOrCopy)(CONCAT44(width,iVar7 << 0x10) + 2);
              }
            }
            else {
              v_00 = (PixOrCopy)((ulong)(uint)(iVar6 << 0x10) | 0x100000002);
              iVar7 = iVar6;
            }
            VP8LBackwardRefsCursorAdd(refs_dst,v_00);
          }
          uVar39 = (uint)(refs_dst->error_ == 0);
        }
        if (uVar39 == 0) goto LAB_0013726f;
        dVar42 = 0.0;
        for (uVar39 = 1; -1 < (int)uVar39; uVar39 = uVar39 - 1) {
          uVar11 = cache_bits_max;
          if (uVar39 == 1) {
            uVar11 = 0;
          }
          uVar24 = (ulong)uVar11;
          if (uVar39 != 1 || do_no_cache != 0) {
            if (uVar39 == 0) {
              cc_init[8] = 0;
              cc_init[9] = 0;
              cc_init[10] = 0;
              cc_init[4] = 0;
              cc_init[5] = 0;
              cc_init[6] = 0;
              cc_init[7] = 0;
              cc_init[0] = 0;
              cc_init[1] = 0;
              cc_init[2] = 0;
              cc_init[3] = 0;
              c.cur_block_ = refs_dst->refs_;
              if (c.cur_block_ == (PixOrCopyBlock *)0x0) {
                pPVar22 = (PixOrCopy *)0x0;
                c.last_pos_ = (PixOrCopy *)0x0;
              }
              else {
                pPVar22 = (c.cur_block_)->start_;
                c.last_pos_ = pPVar22 + (c.cur_block_)->size_;
              }
              c.cur_pos = pPVar22;
              hashers_1.colors_ = (uint32_t *)0x0;
              hashers_1.hash_shift_ = 0;
              hashers_1.hash_bits_ = 0;
              if (uVar36 == 0) {
                uVar11 = 0;
              }
              else {
                pVVar13 = (VP8LColorCache *)window_offsets;
                for (uVar37 = 0; puVar43 = hashers_1.colors_, puVar40 = argb, uVar38 != uVar37;
                    uVar37 = uVar37 + 1) {
                  iVar10 = (int)uVar37;
                  pVVar14 = VP8LAllocateHistogram(iVar10);
                  (&hashers_1.colors_)[uVar37] = (uint32_t *)pVVar14;
                  if (pVVar14 == (VP8LHistogram *)0x0) goto LAB_00136f58;
                  VP8LHistogramInit(pVVar14,iVar10,1);
                  if (uVar37 != 0) {
                    iVar10 = VP8LColorCacheInit(pVVar13,iVar10);
                    cc_init[uVar37] = iVar10;
                    if (iVar10 == 0) goto LAB_00136f58;
                  }
                  pVVar13 = pVVar13 + 1;
                }
                while (pPVar22 != (PixOrCopy *)0x0) {
                  if (pPVar22->mode == '\0') {
                    uVar11 = *puVar40;
                    uVar23 = (ulong)(uVar11 >> 8 & 0xff);
                    uVar32 = uVar11 * 0x1e35a7bd >> (bVar15 & 0x1f);
                    puVar43[(ulong)(uVar11 & 0xff) + 0x102] =
                         puVar43[(ulong)(uVar11 & 0xff) + 0x102] + 1;
                    piVar1 = (int *)(*(long *)puVar43 + uVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar37 = (ulong)(uVar11 >> 0x10 & 0xff);
                    puVar43[uVar37 + 2] = puVar43[uVar37 + 2] + 1;
                    puVar43[(ulong)(uVar11 >> 0x18) + 0x202] =
                         puVar43[(ulong)(uVar11 >> 0x18) + 0x202] + 1;
                    plVar18 = local_1f0;
                    for (pVVar33 = pVVar21; pVVar19 = (VP8LBackwardRefs *)(ulong)uVar32,
                        0 < (int)pVVar33;
                        pVVar33 = (VP8LBackwardRefs *)((long)&pVVar33[-1].last_block_ + 7)) {
                      if (*(uint *)(*plVar18 + (long)pVVar19 * 4) == uVar11) {
                        puVar34 = (uint32_t *)
                                  (*(long *)(&hashers_1.colors_)[(long)pVVar33] +
                                   (long)(int)uVar32 * 4 + 0x460);
                      }
                      else {
                        *(uint *)(*plVar18 + (long)pVVar19 * 4) = uVar11;
                        puVar34 = (&hashers_1.colors_)[(long)pVVar33];
                        puVar34[(ulong)(uVar11 & 0xff) + 0x102] =
                             puVar34[(ulong)(uVar11 & 0xff) + 0x102] + 1;
                        piVar1 = (int *)(*(long *)puVar34 + uVar23 * 4);
                        *piVar1 = *piVar1 + 1;
                        puVar34[uVar37 + 2] = puVar34[uVar37 + 2] + 1;
                        puVar34 = puVar34 + (ulong)(uVar11 >> 0x18) + 0x202;
                      }
                      *puVar34 = *puVar34 + 1;
                      uVar32 = (int)uVar32 >> 1;
                      plVar18 = plVar18 + -2;
                    }
                    puVar40 = puVar40 + 1;
                  }
                  else {
                    uVar3 = pPVar22->len;
                    uVar11 = (uint)uVar3;
                    if (uVar3 < 0x200) {
                      uVar32 = (uint)kPrefixEncodeCode[uVar3].code_;
                    }
                    else {
                      uVar27 = uVar3 - 1;
                      uVar32 = 0x1f;
                      if (uVar27 != 0) {
                        for (; uVar27 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                        }
                      }
                      uVar32 = (uint)((uVar27 >> ((byte)(0x1e - (char)(uVar32 ^ 0x1f)) & 0x1f) & 1)
                                     != 0) + (uVar32 ^ 0x1f) * 2 ^ 0x3e;
                    }
                    uVar27 = ~*puVar40;
                    for (uVar37 = 0; uVar38 != uVar37; uVar37 = uVar37 + 1) {
                      piVar1 = (int *)(*(long *)(&hashers_1.colors_)[uVar37] + 0x400 +
                                      (long)(int)uVar32 * 4);
                      *piVar1 = *piVar1 + 1;
                    }
                    do {
                      uVar32 = *puVar40;
                      if (uVar32 != uVar27) {
                        uVar26 = uVar32 * 0x1e35a7bd >> (bVar15 & 0x1f);
                        plVar18 = local_1f0;
                        for (pVVar19 = pVVar21; uVar27 = uVar32, 0 < (int)pVVar19;
                            pVVar19 = (VP8LBackwardRefs *)(ulong)((int)pVVar19 - 1)) {
                          *(uint *)(*plVar18 + (long)(int)uVar26 * 4) = uVar32;
                          uVar26 = (int)uVar26 >> 1;
                          plVar18 = plVar18 + -2;
                        }
                      }
                      puVar40 = puVar40 + 1;
                      uVar11 = uVar11 - 1;
                      pVVar19 = pVVar21;
                    } while (uVar11 != 0);
                  }
                  VP8LRefsCursorNext(&c);
                  pPVar22 = c.cur_pos;
                }
                puVar43 = (uint32_t *)0x46293e5940000000;
                for (uVar23 = 0; uVar11 = (uint)uVar24, uVar37 = uVar38, uVar38 != uVar23;
                    uVar23 = uVar23 + 1) {
                  local_228 = puVar43;
                  puVar34 = (uint32_t *)
                            VP8LHistogramEstimateBits((VP8LHistogram *)(&hashers_1.colors_)[uVar23])
                  ;
                  puVar43 = local_228;
                  if ((double)puVar34 < (double)local_228 || uVar23 == 0) {
                    uVar24 = uVar23 & 0xffffffff;
                    puVar43 = puVar34;
                  }
                }
LAB_00136f58:
                pVVar13 = (VP8LColorCache *)window_offsets;
                for (uVar24 = 0; uVar38 != uVar24; uVar24 = uVar24 + 1) {
                  if (cc_init[uVar24] != 0) {
                    VP8LColorCacheClear(pVVar13);
                  }
                  VP8LFreeHistogram((VP8LHistogram *)(&hashers_1.colors_)[uVar24]);
                  pVVar13 = pVVar13 + 1;
                }
                if ((long)uVar37 <= lVar12) goto LAB_0013726f;
                if (0 < (int)uVar11) {
                  window_offsets._8_8_ = refs_dst->refs_;
                  if ((PixOrCopyBlock *)window_offsets._8_8_ == (PixOrCopyBlock *)0x0) {
                    pPVar22 = (PixOrCopy *)0x0;
                    window_offsets._16_8_ = (PixOrCopy *)0x0;
                  }
                  else {
                    pPVar22 = ((PixOrCopyBlock *)window_offsets._8_8_)->start_;
                    window_offsets._16_8_ =
                         pPVar22 + ((PixOrCopyBlock *)window_offsets._8_8_)->size_;
                  }
                  window_offsets._0_8_ = pPVar22;
                  iVar10 = VP8LColorCacheInit(&hashers_1,uVar11);
                  if (iVar10 == 0) goto LAB_0013726f;
                  iVar10 = 0;
                  while (pPVar22 != (PixOrCopy *)0x0) {
                    if (pPVar22->mode == '\0') {
                      uVar4 = pPVar22->argb_or_distance;
                      uVar27 = uVar4 * 0x1e35a7bd >> ((byte)hashers_1.hash_shift_ & 0x1f);
                      uVar32 = 0xffffffff;
                      if (hashers_1.colors_[(int)uVar27] == uVar4) {
                        uVar32 = uVar27;
                      }
                      if ((int)uVar32 < 0) {
                        hashers_1.colors_[(int)uVar27] = uVar4;
                      }
                      else {
                        *pPVar22 = (PixOrCopy)((ulong)uVar32 << 0x20 | 0x10001);
                      }
                      iVar6 = iVar10 + 1;
                    }
                    else {
                      iVar6 = (uint)pPVar22->len + iVar10;
                      for (lVar29 = (long)iVar10; iVar6 != lVar29; lVar29 = lVar29 + 1) {
                        uVar32 = argb[lVar29] * 0x1e35a7bd >> ((byte)hashers_1.hash_shift_ & 0x1f);
                        pVVar19 = (VP8LBackwardRefs *)(ulong)uVar32;
                        hashers_1.colors_[(int)uVar32] = argb[lVar29];
                      }
                    }
                    VP8LRefsCursorNext((VP8LRefsCursor *)window_offsets);
                    pPVar22 = (PixOrCopy *)window_offsets._0_8_;
                    iVar10 = iVar6;
                  }
                  VP8LColorCacheClear(&hashers_1);
                }
              }
              if ((do_no_cache == 0) || (uVar32 = 0, uVar11 != 0)) goto LAB_00136b79;
            }
            else {
LAB_00136b79:
              uVar32 = uVar11;
              pVVar14 = local_230;
              VP8LHistogramCreate(local_230,refs_dst,uVar32);
              dVar42 = VP8LHistogramEstimateBits(pVVar14);
            }
            if (dVar42 < bit_costs_best[uVar39]) {
              if (uVar39 == 1) {
                iVar10 = BackwardRefsClone(refs_dst,local_218);
                if (iVar10 == 0) goto LAB_0013726f;
                bit_costs_best[uVar39] = dVar42;
                lz77_types_best[uVar39] = uVar17;
              }
              else {
                BackwardRefsSwap(refs_dst,refs);
                bit_costs_best[uVar39] = dVar42;
                lz77_types_best[uVar39] = uVar17;
                if (uVar39 == 0) {
                  *cache_bits_best = uVar32;
                }
              }
            }
          }
        }
      }
      uVar39 = ~uVar17;
      uVar17 = uVar17 * 2;
      lz77_types_to_try = local_21c & uVar39;
    }
    iVar5 = lz77_types_best[0];
    iVar10 = lz77_types_best[1];
    for (uVar36 = 1; -1 < (int)uVar36; uVar36 = uVar36 - 1) {
      if (uVar36 != 1 || do_no_cache != 0) {
        if (lz77_types_best[uVar36] == 1) {
          hash_chain_00 = hash_chain;
          if (0x18 < quality) {
LAB_0013717b:
            iVar6 = 0;
            if (uVar36 != 1) {
              iVar6 = *cache_bits_best;
            }
            iVar7 = VP8LBackwardReferencesTraceBackwards
                              (width,height,argb,iVar6,hash_chain_00,refs + uVar36,refs_dst);
            pVVar14 = local_230;
            if (iVar7 != 0) {
              VP8LHistogramCreate(local_230,refs_dst,iVar6);
              dVar42 = VP8LHistogramEstimateBits(pVVar14);
              if (dVar42 < bit_costs_best[uVar36]) {
                BackwardRefsSwap(refs_dst,refs + uVar36);
              }
            }
          }
        }
        else if ((0x18 < quality) && (hash_chain_00 = &local_248, lz77_types_best[uVar36] == 4))
        goto LAB_0013717b;
        BackwardReferences2DLocality(width,refs + uVar36);
        if (((uVar36 == 1) && (iVar5 == iVar10)) && (*cache_bits_best == 0)) {
          iVar5 = BackwardRefsClone(local_218,refs);
          if (iVar5 == 0) goto LAB_0013726f;
          break;
        }
      }
    }
    WebPSafeFree(local_248.offset_length_);
    local_248._8_8_ = local_248._8_8_ & 0xffffffff00000000;
    local_248.offset_length_ = (uint32_t *)0x0;
    VP8LFreeHistogram(local_230);
  }
  else {
    *cache_bits_best = 0;
    iVar5 = BackwardReferencesLz77(width,height,argb,(int)hash_chain,(VP8LHashChain *)refs,pVVar19);
    if (iVar5 == 0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    BackwardReferences2DLocality(width,refs);
    if (refs == (VP8LBackwardRefs *)0x0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    BackwardRefsSwap(refs,refs);
  }
  return VP8_ENC_OK;
}

Assistant:

WebPEncodingError VP8LGetBackwardReferences(
    int width, int height, const uint32_t* const argb, int quality,
    int low_effort, int lz77_types_to_try, int cache_bits_max, int do_no_cache,
    const VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs,
    int* const cache_bits_best) {
  if (low_effort) {
    VP8LBackwardRefs* refs_best;
    *cache_bits_best = cache_bits_max;
    refs_best = GetBackwardReferencesLowEffort(
        width, height, argb, cache_bits_best, hash_chain, refs);
    if (refs_best == NULL) return VP8_ENC_ERROR_OUT_OF_MEMORY;
    // Set it in first position.
    BackwardRefsSwap(refs_best, &refs[0]);
  } else {
    if (!GetBackwardReferences(width, height, argb, quality, lz77_types_to_try,
                               cache_bits_max, do_no_cache, hash_chain, refs,
                               cache_bits_best)) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
  }
  return VP8_ENC_OK;
}